

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

MatrixXd *
ear::toPositionsMatrix
          (MatrixXd *__return_storage_ptr__,
          vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *positions)

{
  PolarPosition position;
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  double in_stack_ffffffffffffff30;
  RowXpr local_b0;
  double local_68;
  double dStack_60;
  double local_58;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_48 [24];
  uint local_30;
  int local_2c;
  uint i;
  undefined1 local_19;
  vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *local_18;
  vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *positions_local;
  MatrixXd *ret;
  
  local_19 = 0;
  local_18 = positions;
  positions_local =
       (vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_> *)__return_storage_ptr__;
  _i = std::vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>::size(positions);
  local_2c = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(unsigned_long *)&i,&local_2c);
  for (local_30 = 0; uVar3 = (ulong)local_30,
      sVar4 = std::vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>::size(local_18),
      uVar3 < sVar4; local_30 = local_30 + 1) {
    pvVar5 = std::vector<ear::PolarPosition,_std::allocator<ear::PolarPosition>_>::operator[]
                       (local_18,(ulong)local_30);
    local_58 = pvVar5->distance;
    local_68 = pvVar5->azimuth;
    dStack_60 = pvVar5->elevation;
    uVar1 = pvVar5->elevation;
    uVar2 = pvVar5->distance;
    position.elevation = (double)uVar2;
    position.azimuth = (double)uVar1;
    position.distance = in_stack_ffffffffffffff30;
    toCartesianVector3d(position);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_b0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               (ulong)local_30);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_b0,local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd toPositionsMatrix(
      const std::vector<PolarPosition>& positions) {
    Eigen::MatrixXd ret(positions.size(), 3);
    for (unsigned int i = 0; i < positions.size(); ++i) {
      ret.row(i) = toCartesianVector3d(positions[i]);
    }
    return ret;
  }